

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawUtil.cpp
# Opt level: O2

void vkt::drawutil::beginCommandBuffer(DeviceInterface *vk,VkCommandBuffer commandBuffer)

{
  VkResult result;
  VkCommandBufferBeginInfo info;
  
  result = (*vk->_vptr_DeviceInterface[0x49])();
  ::vk::checkResult(result,"vk.beginCommandBuffer(commandBuffer, &info)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktDrawUtil.cpp"
                    ,0xf3);
  return;
}

Assistant:

void beginCommandBuffer (const DeviceInterface& vk, const VkCommandBuffer commandBuffer)
{
	const VkCommandBufferBeginInfo info =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType							sType;
		DE_NULL,										// const void*								pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// VkCommandBufferUsageFlags				flags;
		DE_NULL,										// const VkCommandBufferInheritanceInfo*	pInheritanceInfo;
	};
	VK_CHECK(vk.beginCommandBuffer(commandBuffer, &info));
}